

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Monomorphize.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_223::Monomorphize::Monomorphize(Monomorphize *this,bool onlyWhenHelpful)

{
  bool onlyWhenHelpful_local;
  Monomorphize *this_local;
  
  Pass::Pass(&this->super_Pass);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__Monomorphize_02718cc0;
  this->onlyWhenHelpful = onlyWhenHelpful;
  std::
  unordered_map<std::pair<wasm::Name,_wasm::Type>,_wasm::Name,_std::hash<std::pair<wasm::Name,_wasm::Type>_>,_std::equal_to<std::pair<wasm::Name,_wasm::Type>_>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::Type>,_wasm::Name>_>_>
  ::unordered_map(&this->funcParamMap);
  return;
}

Assistant:

Monomorphize(bool onlyWhenHelpful) : onlyWhenHelpful(onlyWhenHelpful) {}